

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

_Bool fy_node_clear_marker(fy_node *fyn,uint marker)

{
  uint uVar1;
  
  if (0x18 < marker || fyn == (fy_node *)0x0) {
    return false;
  }
  uVar1 = fyn->marks;
  fyn->marks = uVar1 & ~(1 << (marker & 0x1f));
  return (uVar1 >> (marker & 0x1f) & 1) != 0;
}

Assistant:

bool fy_node_clear_marker(struct fy_node *fyn, unsigned int marker) {
    unsigned int prev_marks;

    if (!fyn || marker > FYNWF_MAX_USER_MARKER)
        return false;
    prev_marks = fyn->marks;
    fyn->marks &= ~FY_BIT(marker);
    return !!(prev_marks & FY_BIT(marker));
}